

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int in_EDX;
  int extraout_EDX;
  FieldDescriptor *pFVar4;
  FieldDescriptor *field_local;
  int new_index;
  
  pFVar4 = field;
  field_local = field;
  if ((*(char *)((long)this + 0x40) != '\0') ||
     ((*(long **)((long)this + 0x48) != *(long **)((long)this + 0x50) &&
      (*(long *)(**(long **)((long)this + 0x48) + 0x58) != *(long *)(field + 0x58))))) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
    in_EDX = extraout_EDX;
  }
  if (*(long *)(field + 0x58) == 0) {
    if (((*(char *)(*(long *)(field + 0x78) + 0x4f) == '\0') && (*(int *)(field + 0x3c) != 3)) &&
       (*(char *)((long)this + 0x40) == '\0')) {
      lVar1 = *this;
      pcVar3 = FieldDescriptor::index(field,(char *)pFVar4,in_EDX);
      iVar2 = *(int *)(*(long *)(lVar1 + 0x108) + (long)(int)pcVar3 * 4) / 0x20;
      if (*(int *)((long)this + 0x60) != iVar2) {
        new_index = iVar2;
        Formatter::operator()
                  ((Formatter *)((long)this + 8),"cached_has_bits = _has_bits_[$1$];\n",&new_index);
        *(int *)((long)this + 0x60) = new_index;
      }
    }
    GenerateSerializeOneField(*this,*(Printer **)((long)this + 8),field,*(int *)((long)this + 0x60))
    ;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x48),&field_local);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }